

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

size_t drwav_write_raw(drwav *pWav,size_t bytesToWrite,void *pData)

{
  size_t sVar1;
  
  if (pData == (void *)0x0 || (bytesToWrite == 0 || pWav == (drwav *)0x0)) {
    return 0;
  }
  sVar1 = (*pWav->onWrite)(pWav->pUserData,pData,bytesToWrite);
  pWav->dataChunkDataSize = pWav->dataChunkDataSize + sVar1;
  return sVar1;
}

Assistant:

DRWAV_API size_t drwav_write_raw(drwav* pWav, size_t bytesToWrite, const void* pData)
{
    size_t bytesWritten;

    if (pWav == NULL || bytesToWrite == 0 || pData == NULL) {
        return 0;
    }

    bytesWritten = pWav->onWrite(pWav->pUserData, pData, bytesToWrite);
    pWav->dataChunkDataSize += bytesWritten;

    return bytesWritten;
}